

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O2

upb_MiniTableEnum *
upb_MiniTableEnum_Build(char *data,size_t len,upb_Arena *arena,upb_Status *status)

{
  upb_MiniTableEnum *puVar1;
  upb_MdEnumDecoder local_120;
  
  memset(local_120.base.err,0,0xe8);
  local_120.base.end = data + len;
  local_120.base.status = status;
  local_120.arena = arena;
  local_120.enum_table = (upb_MiniTableEnum *)upb_Arena_Malloc(arena,0x10);
  local_120.enum_data_capacity = 2;
  puVar1 = upb_MtDecoder_BuildMiniTableEnum(&local_120,data,len);
  return puVar1;
}

Assistant:

upb_MiniTableEnum* upb_MiniTableEnum_Build(const char* data, size_t len,
                                           upb_Arena* arena,
                                           upb_Status* status) {
  uint32_t initial_capacity = 2;
  upb_MdEnumDecoder decoder = {
      .base =
          {
              .end = UPB_PTRADD(data, len),
              .status = status,
          },
      .arena = arena,
      .enum_table =
          upb_Arena_Malloc(arena, upb_MiniTableEnum_Size(initial_capacity)),
      .enum_value_count = 0,
      .enum_data_count = 0,
      .enum_data_capacity = initial_capacity,
  };

  return upb_MtDecoder_BuildMiniTableEnum(&decoder, data, len);
}